

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

void EDLines::SplitSegment2Lines
               (double *x,double *y,int noPixels,int segmentNo,
               vector<LineSegment,_std::allocator<LineSegment>_> *lines,int min_line_len,
               double line_error)

{
  pointer *ppLVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint count;
  ulong uVar12;
  LineSegment *pLVar13;
  iterator __position;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  byte bVar20;
  double dVar21;
  int lastInvert;
  double lastB;
  double lastA;
  double error;
  int local_fc;
  double local_f8;
  double local_f0;
  ulong local_e8;
  ulong local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  int local_a8;
  int local_a4;
  vector<LineSegment,_std::allocator<LineSegment>_> *local_a0;
  double *local_98;
  ulong local_90;
  double *local_88;
  double *local_80;
  LineSegment local_78;
  
  bVar20 = 0;
  uVar12 = (ulong)(uint)min_line_len;
  local_a8 = min_line_len + -1;
  local_b8 = line_error;
  local_a4 = segmentNo;
  local_a0 = lines;
  local_90 = uVar12;
  iVar7 = 0;
  do {
    iVar17 = (int)uVar12;
    if (noPixels < iVar17) {
      return;
    }
    LineFit(x,y,iVar17,&local_c0,&local_c8,&local_b0,&local_fc);
    iVar9 = noPixels;
    if (local_b0 <= 0.5) {
      bVar4 = false;
    }
    else {
      iVar11 = (noPixels - iVar17) + iVar7 + 1;
      do {
        x = x + 1;
        y = y + 1;
        bVar4 = iVar9 <= iVar17;
        noPixels = local_a8;
        if (iVar9 <= iVar17) goto LAB_0011932a;
        iVar7 = iVar7 + 1;
        iVar9 = iVar9 + -1;
        LineFit(x,y,iVar17,&local_c0,&local_c8,&local_b0,&local_fc);
      } while (0.5 < local_b0);
    }
    iVar17 = local_fc;
    local_80 = x + 1;
    local_88 = y + 1;
    uVar16 = uVar12 & 0xffffffff;
    uVar12 = uVar12 & 0xffffffff;
    local_98 = y;
    do {
      iVar15 = (int)uVar12;
      if (iVar9 <= (int)uVar16) break;
      local_e0 = (ulong)((int)uVar16 - 1);
      local_d0 = local_c0;
      iVar18 = 0;
      local_d8 = local_c8;
      iVar11 = 0;
      local_e8 = uVar16;
      do {
        iVar14 = (int)uVar16;
        if (iVar9 <= iVar14) break;
        dVar21 = ComputeMinDistance(x[iVar14],y[iVar14],local_d0,local_d8,iVar17);
        if (dVar21 <= local_b8) {
          iVar18 = iVar18 + 1;
          iVar8 = 0;
          local_e0 = uVar16 & 0xffffffff;
LAB_00118fa2:
          uVar16 = (ulong)(iVar14 + 1);
          bVar3 = true;
          iVar11 = iVar8;
        }
        else {
          iVar8 = iVar11 + 1;
          if (iVar11 < 4) goto LAB_00118fa2;
          bVar3 = false;
          iVar11 = iVar8;
        }
      } while (bVar3);
      if (1 < iVar18) {
        iVar11 = (int)local_e0;
        count = (iVar15 - (int)local_e8) + iVar11 + 1;
        uVar12 = (ulong)count;
        LineFit(x,y,count,&local_c0,&local_c8,iVar17);
        uVar16 = (ulong)(iVar11 + 1);
      }
      bVar3 = (int)uVar16 < iVar9;
      if (!bVar3 || 1 >= iVar18) {
        local_d0 = local_c0;
        local_d8 = local_c8;
        lVar19 = 0;
        do {
          lVar10 = lVar19;
          dVar21 = ComputeMinDistance(x[lVar10],y[lVar10],local_d0,local_d8,iVar17);
          pdVar6 = local_80;
          pdVar5 = local_88;
          lVar19 = lVar10 + 1;
        } while (local_b8 < dVar21);
        local_f8 = x[lVar10];
        local_f0 = y[lVar10];
        if (iVar17 == 0) {
          if ((local_d8 != 0.0) || (NAN(local_d8))) {
            local_f8 = (local_d0 - (local_f0 - local_f8 * (-1.0 / local_d8))) /
                       (-1.0 / local_d8 - local_d8);
            local_f0 = local_d8 * local_f8 + local_d0;
          }
          else {
            local_f0 = local_d0;
          }
        }
        else if ((local_d8 != 0.0) || (NAN(local_d8))) {
          local_f0 = (local_d0 - (local_f8 - local_f0 * (-1.0 / local_d8))) /
                     (-1.0 / local_d8 - local_d8);
          local_f8 = local_d8 * local_f0 + local_d0;
        }
        else {
          local_f8 = local_d0;
        }
        iVar11 = (int)local_e0;
        iVar15 = (iVar11 - (int)lVar10) + 2;
        lVar19 = 0;
        local_e8 = uVar16;
        do {
          dVar21 = ComputeMinDistance(pdVar6[(long)iVar11 + lVar19 + -1],
                                      pdVar5[(long)iVar11 + lVar19 + -1],local_d0,local_d8,iVar17);
          y = local_98;
          lVar19 = lVar19 + -1;
          iVar15 = iVar15 + -1;
        } while (local_b8 < dVar21);
        dVar21 = pdVar6[iVar11 + lVar19];
        dVar2 = pdVar5[iVar11 + lVar19];
        if (iVar17 == 0) {
          if ((local_d8 != 0.0) || (local_78.ey = local_d0, local_78.ex = dVar21, NAN(local_d8))) {
            local_78.ex = (local_d0 - (dVar2 - dVar21 * (-1.0 / local_d8))) /
                          (-1.0 / local_d8 - local_d8);
            local_78.ey = local_d8 * local_78.ex + local_d0;
          }
        }
        else if ((local_d8 != 0.0) || (local_78.ey = dVar2, local_78.ex = local_d0, NAN(local_d8)))
        {
          local_78.ey = (local_d0 - (dVar21 - dVar2 * (-1.0 / local_d8))) /
                        (-1.0 / local_d8 - local_d8);
          local_78.ex = local_d8 * local_78.ey + local_d0;
        }
        local_78.a = local_d0;
        local_78.b = local_d8;
        local_78.invert = iVar17;
        local_78.sx = local_f8;
        local_78.sy = local_f0;
        local_78.segmentNo = local_a4;
        local_78.firstPixelIndex = (int)lVar10 + iVar7;
        local_78.len = iVar15;
        __position._M_current =
             (local_a0->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (local_a0->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<LineSegment,_std::allocator<LineSegment>_>::_M_realloc_insert<LineSegment>
                    (local_a0,__position,&local_78);
        }
        else {
          pLVar13 = &local_78;
          for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
            (__position._M_current)->a = pLVar13->a;
            pLVar13 = (LineSegment *)((long)pLVar13 + ((ulong)bVar20 * -2 + 1) * 8);
            __position._M_current = __position._M_current + (ulong)bVar20 * -0x10 + 8;
          }
          ppLVar1 = &(local_a0->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
        uVar12 = (ulong)((int)local_e0 + (int)lVar19 + 2);
        uVar16 = local_e8;
      }
      iVar15 = (int)uVar12;
    } while (bVar3 && 1 < iVar18);
    x = x + iVar15;
    y = y + iVar15;
    iVar11 = iVar15 + iVar7;
    uVar12 = local_90;
    noPixels = iVar9 - iVar15;
LAB_0011932a:
    iVar7 = iVar11;
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void EDLines::SplitSegment2Lines(double * x, double * y, int noPixels, int segmentNo, vector<LineSegment> &lines, int min_line_len, double line_error)
{
	// First pixel of the line segment within the segment of points
	int firstPixelIndex = 0;

	while (noPixels >= min_line_len) {
		// Start by fitting a line to MIN_LINE_LEN pixels
		bool valid = false;
		double lastA, lastB, error;
		int lastInvert;

		while (noPixels >= min_line_len) {
			LineFit(x, y, min_line_len, lastA, lastB, error, lastInvert);
			if (error <= 0.5) { valid = true; break; }

#if 1
			noPixels -= 1;   // Go slowly
			x += 1; y += 1;
			firstPixelIndex += 1;
#else
			noPixels -= 2;   // Go faster (for speed)
			x += 2; y += 2;
			firstPixelIndex += 2;
#endif
		} //end-while

		if (valid == false) return;

		// Now try to extend this line
		int index = min_line_len;
		int len = min_line_len;

		while (index < noPixels) {
			int startIndex = index;
			int lastGoodIndex = index - 1;
			int goodPixelCount = 0;
			int badPixelCount = 0;
			while (index < noPixels) {
				double d = ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert);

				if (d <= line_error) {
					lastGoodIndex = index;
					goodPixelCount++;
					badPixelCount = 0;

				}
				else {
					badPixelCount++;
					if (badPixelCount >= 5) break;
				} //end-if

				index++;
			} //end-while

			if (goodPixelCount >= 2) {
				len += lastGoodIndex - startIndex + 1;
				LineFit(x, y, len, lastA, lastB, lastInvert);  // faster LineFit
				index = lastGoodIndex + 1;
			} // end-if

			if (goodPixelCount < 2 || index >= noPixels) {
				// End of a line segment. Compute the end points
				double sx, sy, ex, ey;

				int index = 0;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index++;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, sx, sy);
				int noSkippedPixels = index;

				index = lastGoodIndex;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index--;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, ex, ey);

				// Add the line segment to lines
				lines.push_back(LineSegment(lastA, lastB, lastInvert, sx, sy, ex, ey, segmentNo, firstPixelIndex + noSkippedPixels, index - noSkippedPixels + 1));
				//linesNo++;
				len = index + 1;
				break;
			} //end-else
		} //end-while

		noPixels -= len;
		x += len;
		y += len;
		firstPixelIndex += len;
	} //end-while
}